

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O0

Prog * __thiscall re2::Prog::DumpByteMap_abi_cxx11_(Prog *this)

{
  int iVar1;
  uint uVar2;
  long in_RSI;
  bool bVar3;
  int hi;
  int lo;
  int b;
  int c;
  Prog *this_local;
  string *map;
  
  std::__cxx11::string::string((string *)this);
  for (lo = 0; iVar1 = lo, lo < 0x100; lo = lo + 1) {
    uVar2 = (uint)*(byte *)(in_RSI + 0xa0 + (long)lo);
    while( true ) {
      bVar3 = false;
      if (lo < 0xff) {
        bVar3 = *(byte *)(in_RSI + 0xa0 + (long)(lo + 1)) == uVar2;
      }
      if (!bVar3) break;
      lo = lo + 1;
    }
    StringAppendF((string *)this,"[%02x-%02x] -> %d\n",(ulong)(uint)iVar1,(ulong)(uint)lo,
                  (ulong)uVar2);
  }
  return this;
}

Assistant:

string Prog::DumpByteMap() {
  string map;
  for (int c = 0; c < 256; c++) {
    int b = bytemap_[c];
    int lo = c;
    while (c < 256-1 && bytemap_[c+1] == b)
      c++;
    int hi = c;
    StringAppendF(&map, "[%02x-%02x] -> %d\n", lo, hi, b);
  }
  return map;
}